

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::real(Path *__return_storage_ptr__,Path *this)

{
  char *pcVar1;
  ErrnoError *this_00;
  int *piVar2;
  allocator local_1089;
  string local_1088 [32];
  Pathie local_1068 [48];
  char local_1038 [8];
  char path [4096];
  string nstr;
  Path *this_local;
  
  native_abi_cxx11_((Path *)(path + 0xff8));
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = realpath(pcVar1,local_1038);
  if (pcVar1 == (char *)0x0) {
    this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    ErrnoError::ErrnoError(this_00,*piVar2);
    __cxa_throw(this_00,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1088,local_1038,&local_1089);
  filename_to_utf8(local_1068,(string *)local_1088);
  Path(__return_storage_ptr__,(string *)local_1068);
  std::__cxx11::string::~string((string *)local_1068);
  std::__cxx11::string::~string(local_1088);
  std::allocator<char>::~allocator((allocator<char> *)&local_1089);
  std::__cxx11::string::~string((string *)(path + 0xff8));
  return __return_storage_ptr__;
}

Assistant:

Path Path::real() const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();
  char path[PATH_MAX];
  if (!realpath(nstr.c_str(), path))
    throw(Pathie::ErrnoError(errno));

  return Path(filename_to_utf8(path));
#elif defined(_WIN32)
  // On Windows there sadly is no easy way to do this. We can
  // only determine if a given path is a symlink and resolve it...
  // Instructions taken from: http://msdn.microsoft.com/en-us/library/windows/desktop/aa363940%28v=vs.85%29.aspx
  std::vector<Path> components = burst();
  unsigned int pos = 0;

  while (pos < components.size()) {
    // Build path consisting of all elements upto our position pointer
    Path reduced_path(components.front());
    if (components.size() - pos > 1) {
      for (unsigned int i=1; i <= pos; i++) { // i=0 is already in the initialization above
        reduced_path = reduced_path.join(components[i]);
      }
    }

    // If that’s a symlink, resolve it and replace our path until
    // the symlink with the symlink’s target.
    /*std::wstring reduced_path_utf16 = utf8_to_utf16(reduced_path.m_path);
    if (is_ntfs_symlink(reduced_path_utf16.c_str())) {
      wchar_t* target_utf16 = read_ntfs_symlink(reduced_path_utf16.c_str());
      Path target(utf16_to_utf8(target_utf16));
      std::vector<Path> target_components = target.burst();
      free(target_utf16);

      // Replace all components up to pos with the symlink target
      components.erase(components.begin(), components.begin() + pos);
      std::vector<Path> temp(components);
      components.clear();
      for(auto iter=target_components.begin(); iter != target_components.end(); iter++)
        components.push_back(*iter);
      for(auto iter=temp.begin(); iter != temp.end(); iter++)
        components.push_back(*iter);
    }
    else {*/
      // Note a symlink can point to another symlink, so we can only
      // advance to the next element if this element has been tested
      // for not being a symlink.
      pos++;
      //}
  }

  // BUild a new path from the now resolved components
  Path result(components.front());
  if (components.size() > 1) {
    for(std::vector<Path>::const_iterator iter=components.begin();
    		iter != components.end(); iter++) {
      result = result.join(*iter);
    }
  }

  return result;
#else
#error Unsupported system.
#endif
}